

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

void Emb_ManDerivePlacement(Emb_Man_t *p,int nSols)

{
  uint nSize;
  int iVar1;
  float *pArray;
  int *__ptr;
  int *__ptr_00;
  unsigned_short *puVar2;
  ulong uVar3;
  long lVar4;
  unsigned_short uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  float *pArray_00;
  float fVar9;
  float fVar10;
  
  if (nSols != 2) {
    return;
  }
  pArray = p->pSols;
  nSize = p->nObjs;
  uVar6 = (ulong)nSize;
  if ((long)(int)nSize < 1) {
LAB_0068e27e:
    pArray_00 = pArray + (int)nSize;
  }
  else {
    fVar9 = 1e+09;
    fVar10 = -1e+09;
    uVar3 = 0;
    do {
      iVar7 = (int)pArray[uVar3];
      iVar1 = (int)fVar9;
      if (iVar7 <= (int)fVar9) {
        iVar1 = iVar7;
      }
      fVar9 = (float)iVar1;
      if (iVar7 < (int)fVar10) {
        iVar7 = (int)fVar10;
      }
      fVar10 = (float)iVar7;
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
    if ((int)nSize < 1) goto LAB_0068e27e;
    uVar3 = 0;
    do {
      pArray[uVar3] =
           (float)(-(uint)(pArray[uVar3] != 0.0) &
                  (uint)((pArray[uVar3] - fVar9) * (32767.0 / (fVar10 - fVar9))));
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
    pArray_00 = pArray + uVar6;
    if (0 < (int)nSize) {
      fVar9 = 1e+09;
      fVar10 = -1e+09;
      uVar3 = 0;
      do {
        iVar7 = (int)pArray_00[uVar3];
        iVar1 = (int)fVar9;
        if (iVar7 <= (int)fVar9) {
          iVar1 = iVar7;
        }
        fVar9 = (float)iVar1;
        if (iVar7 < (int)fVar10) {
          iVar7 = (int)fVar10;
        }
        fVar10 = (float)iVar7;
        uVar3 = uVar3 + 1;
      } while (uVar6 != uVar3);
      if (0 < (int)nSize) {
        uVar3 = 0;
        do {
          pArray_00[uVar3] =
               (float)(-(uint)(pArray_00[uVar3] != 0.0) &
                      (uint)((pArray_00[uVar3] - fVar9) * (32767.0 / (fVar10 - fVar9))));
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
    }
  }
  __ptr = Gia_SortFloats(pArray,(int *)0x0,nSize);
  __ptr_00 = Gia_SortFloats(pArray_00,(int *)0x0,p->nObjs);
  iVar1 = p->nObjs;
  lVar8 = (long)iVar1;
  puVar2 = (unsigned_short *)malloc(lVar8 * 4);
  p->pPlacement = puVar2;
  if (lVar8 < 1) {
    if (__ptr == (int *)0x0) goto LAB_0068e303;
  }
  else {
    lVar4 = 0;
    do {
      uVar5 = (unsigned_short)(int)(((double)(int)lVar4 * 32767.0) / (double)iVar1);
      puVar2[(long)__ptr[lVar4] * 2] = uVar5;
      puVar2[(long)__ptr_00[lVar4] * 2 + 1] = uVar5;
      lVar4 = lVar4 + 1;
    } while (lVar8 != lVar4);
  }
  free(__ptr);
LAB_0068e303:
  if (__ptr_00 == (int *)0x0) {
    return;
  }
  free(__ptr_00);
  return;
}

Assistant:

void Emb_ManDerivePlacement( Emb_Man_t * p, int nSols )
{
    float * pY0, * pY1, Max0, Max1, Min0, Min1, Str0, Str1;
    int * pPerm0, * pPerm1;
    int k;
    if ( nSols != 2 )
        return;
    // compute intervals
    Min0 =  ABC_INFINITY;
    Max0 = -ABC_INFINITY;
    pY0 = Emb_ManSol( p, 0 );
    for ( k = 0; k < p->nObjs; k++ )
    {
        Min0 = Abc_MinInt( Min0, pY0[k] );
        Max0 = Abc_MaxInt( Max0, pY0[k] );
    }
    Str0 = 1.0*GIA_PLACE_SIZE/(Max0 - Min0);
    // update the coordinates
    for ( k = 0; k < p->nObjs; k++ )
        pY0[k] = (pY0[k] != 0.0) ? ((pY0[k] - Min0) * Str0) : 0.0;

    // compute intervals
    Min1 =  ABC_INFINITY;
    Max1 = -ABC_INFINITY;
    pY1 = Emb_ManSol( p, 1 );
    for ( k = 0; k < p->nObjs; k++ )
    {
        Min1 = Abc_MinInt( Min1, pY1[k] );
        Max1 = Abc_MaxInt( Max1, pY1[k] );
    }
    Str1 = 1.0*GIA_PLACE_SIZE/(Max1 - Min1);
    // update the coordinates
    for ( k = 0; k < p->nObjs; k++ )
        pY1[k] = (pY1[k] != 0.0) ? ((pY1[k] - Min1) * Str1) : 0.0;

    // derive the order of these numbers
    pPerm0 = Gia_SortFloats( pY0, NULL, p->nObjs );
    pPerm1 = Gia_SortFloats( pY1, NULL, p->nObjs );

    // average solutions and project them into square [0;GIA_PLACE_SIZE] x [0;GIA_PLACE_SIZE]
    p->pPlacement = ABC_ALLOC( unsigned short, 2 * p->nObjs );
    for ( k = 0; k < p->nObjs; k++ )
    {
        p->pPlacement[2*pPerm0[k]+0] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
        p->pPlacement[2*pPerm1[k]+1] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
    }
    ABC_FREE( pPerm0 );
    ABC_FREE( pPerm1 );
}